

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cc_helper_template.h
# Opt level: O0

int compute_all_logicq(uint64_t dst,uint64_t src1)

{
  byte bVar1;
  target_long tVar2;
  int of;
  int sf;
  int zf;
  int af;
  int pf;
  int cf;
  uint64_t src1_local;
  uint64_t dst_local;
  
  bVar1 = "\x04"[dst & 0xff];
  tVar2 = lshift(dst,-0x38);
  return (uint)bVar1 | (uint)(dst == 0) << 6 | (uint)tVar2 & 0x80;
}

Assistant:

static int glue(compute_all_logic, SUFFIX)(DATA_TYPE dst, DATA_TYPE src1)
{
    int cf, pf, af, zf, sf, of;

    cf = 0;
    pf = parity_table[(uint8_t)dst];
    af = 0;
    zf = (dst == 0) * CC_Z;
    sf = lshift(dst, 8 - DATA_BITS) & CC_S;
    of = 0;
    return cf | pf | af | zf | sf | of;
}